

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O2

int __thiscall
ncnn::Concat::forward
          (Concat *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint _c;
  pointer pMVar2;
  size_t _elemsize;
  Mat *pMVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  size_t b;
  ulong uVar8;
  int iVar9;
  int *piVar10;
  void *pvVar11;
  size_t b_2;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  size_t b_5;
  ulong uVar15;
  size_t b_4;
  bool bVar16;
  int local_60;
  
  pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = pMVar2->dims;
  _elemsize = pMVar2->elemsize;
  if (uVar1 == 1) {
    lVar4 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar2) / 0x48;
    piVar10 = &pMVar2->w;
    iVar9 = 0;
    while (bVar16 = lVar4 != 0, lVar4 = lVar4 + -1, bVar16) {
      iVar9 = iVar9 + *piVar10;
      piVar10 = piVar10 + 0x12;
    }
    pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar3,iVar9,_elemsize,opt->blob_allocator);
    pvVar11 = pMVar3->data;
    local_60 = -100;
    if ((pvVar11 != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
      local_60 = 0;
      lVar4 = 0;
      for (uVar8 = 0;
          pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start,
          uVar8 < (ulong)(((long)(bottom_blobs->
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pMVar2) / 0x48);
          uVar8 = uVar8 + 1) {
        sVar12 = (long)*(int *)((long)&pMVar2->w + lVar4) * _elemsize;
        memcpy(pvVar11,*(void **)((long)&pMVar2->data + lVar4),sVar12);
        pvVar11 = (void *)((long)pvVar11 + sVar12);
        lVar4 = lVar4 + 0x48;
      }
    }
  }
  else {
    iVar9 = (this->axis >> 0x1f & uVar1) + this->axis;
    if ((uVar1 == 2) && (iVar9 == 0)) {
      iVar9 = pMVar2->w;
      lVar4 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x48;
      piVar10 = &pMVar2->h;
      iVar5 = 0;
      while (bVar16 = lVar4 != 0, lVar4 = lVar4 + -1, bVar16) {
        iVar5 = iVar5 + *piVar10;
        piVar10 = piVar10 + 0x12;
      }
      pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar3,iVar9,iVar5,_elemsize,opt->blob_allocator);
      pvVar11 = pMVar3->data;
      local_60 = -100;
      if ((pvVar11 != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
        local_60 = 0;
        lVar4 = 0;
        for (uVar8 = 0;
            pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start,
            uVar8 < (ulong)(((long)(bottom_blobs->
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x48)
            ; uVar8 = uVar8 + 1) {
          sVar12 = (long)*(int *)((long)&pMVar2->h + lVar4) * _elemsize * (long)iVar9;
          memcpy(pvVar11,*(void **)((long)&pMVar2->data + lVar4),sVar12);
          pvVar11 = (void *)((long)pvVar11 + sVar12);
          lVar4 = lVar4 + 0x48;
        }
      }
    }
    else if ((uVar1 == 2) && (iVar9 == 1)) {
      uVar1 = pMVar2->h;
      lVar4 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x48;
      piVar10 = &pMVar2->w;
      iVar9 = 0;
      while (bVar16 = lVar4 != 0, lVar4 = lVar4 + -1, bVar16) {
        iVar9 = iVar9 + *piVar10;
        piVar10 = piVar10 + 0x12;
      }
      pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar3,iVar9,uVar1,_elemsize,opt->blob_allocator);
      local_60 = -100;
      if ((pMVar3->data != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
        local_60 = 0;
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        for (uVar8 = 0; uVar8 != uVar1; uVar8 = uVar8 + 1) {
          pvVar11 = (void *)((long)pMVar3->w * uVar8 * pMVar3->elemsize + (long)pMVar3->data);
          lVar4 = 0x2c;
          uVar13 = 0;
          while( true ) {
            pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar2) / 0x48) <= uVar13)
            break;
            lVar6 = (long)*(int *)((long)&pMVar2->data + lVar4);
            memcpy(pvVar11,(void *)(uVar8 * lVar6 * *(long *)((long)pMVar2 + lVar4 + -0x1c) +
                                   *(long *)((long)pMVar2 + lVar4 + -0x2c)),lVar6 * _elemsize);
            pvVar11 = (void *)((long)pvVar11 +
                              (long)*(int *)((long)&pMVar2->data + lVar4) * _elemsize);
            uVar13 = uVar13 + 1;
            lVar4 = lVar4 + 0x48;
          }
        }
      }
    }
    else if ((uVar1 == 3) && (iVar9 == 0)) {
      lVar4 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x48;
      piVar10 = &pMVar2->c;
      iVar9 = 0;
      while (bVar16 = lVar4 != 0, lVar4 = lVar4 + -1, bVar16) {
        iVar9 = iVar9 + *piVar10;
        piVar10 = piVar10 + 0x12;
      }
      pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar3,pMVar2->w,pMVar2->h,iVar9,_elemsize,opt->blob_allocator);
      local_60 = -100;
      if ((pMVar3->data != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
        local_60 = 0;
        lVar4 = 0x40;
        iVar9 = 0;
        for (uVar8 = 0;
            pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start,
            uVar8 < (ulong)(((long)(bottom_blobs->
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x48)
            ; uVar8 = uVar8 + 1) {
          iVar5 = *(int *)((long)pMVar2 + lVar4 + -8);
          memcpy((void *)(pMVar3->cstep * (long)iVar9 * pMVar3->elemsize + (long)pMVar3->data),
                 *(void **)((long)pMVar2 + lVar4 + -0x40),
                 (long)iVar5 * _elemsize * *(long *)((long)&pMVar2->data + lVar4));
          iVar9 = iVar9 + iVar5;
          lVar4 = lVar4 + 0x48;
        }
      }
    }
    else if ((uVar1 == 3) && (iVar9 == 1)) {
      uVar1 = pMVar2->c;
      lVar4 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x48;
      piVar10 = &pMVar2->h;
      iVar9 = 0;
      while (bVar16 = lVar4 != 0, lVar4 = lVar4 + -1, bVar16) {
        iVar9 = iVar9 + *piVar10;
        piVar10 = piVar10 + 0x12;
      }
      pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar3,pMVar2->w,iVar9,uVar1,_elemsize,opt->blob_allocator);
      local_60 = -100;
      if ((pMVar3->data != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
        local_60 = 0;
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        for (uVar8 = 0; uVar8 != uVar1; uVar8 = uVar8 + 1) {
          pvVar11 = (void *)(pMVar3->cstep * uVar8 * pMVar3->elemsize + (long)pMVar3->data);
          lVar4 = 0x40;
          for (uVar13 = 0;
              pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_start,
              uVar13 < (ulong)(((long)(bottom_blobs->
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) /
                              0x48); uVar13 = uVar13 + 1) {
            sVar12 = (long)*(int *)((long)pMVar2 + lVar4 + -0x10) *
                     (long)*(int *)((long)pMVar2 + lVar4 + -0x14) * _elemsize;
            memcpy(pvVar11,(void *)(*(long *)((long)&pMVar2->data + lVar4) * uVar8 *
                                    *(long *)((long)pMVar2 + lVar4 + -0x30) +
                                   *(long *)((long)pMVar2 + lVar4 + -0x40)),sVar12);
            pvVar11 = (void *)((long)pvVar11 + sVar12);
            lVar4 = lVar4 + 0x48;
          }
        }
      }
    }
    else {
      local_60 = 0;
      if ((uVar1 == 3) && (iVar9 == 2)) {
        uVar1 = pMVar2->h;
        _c = pMVar2->c;
        lVar4 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x48;
        piVar10 = &pMVar2->w;
        iVar9 = 0;
        while (bVar16 = lVar4 != 0, lVar4 = lVar4 + -1, bVar16) {
          iVar9 = iVar9 + *piVar10;
          piVar10 = piVar10 + 0x12;
        }
        pMVar3 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        Mat::create(pMVar3,iVar9,uVar1,_c,_elemsize,opt->blob_allocator);
        local_60 = -100;
        if ((pMVar3->data != (void *)0x0) && ((long)pMVar3->c * pMVar3->cstep != 0)) {
          if ((int)uVar1 < 1) {
            uVar1 = 0;
          }
          local_60 = 0;
          uVar8 = (ulong)_c;
          if ((int)_c < 1) {
            uVar8 = 0;
          }
          for (uVar13 = 0; uVar13 != uVar8; uVar13 = uVar13 + 1) {
            pvVar11 = (void *)(pMVar3->cstep * uVar13 * pMVar3->elemsize + (long)pMVar3->data);
            for (uVar14 = 0; uVar14 != uVar1; uVar14 = uVar14 + 1) {
              lVar4 = 0x40;
              uVar15 = 0;
              while( true ) {
                pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                if ((ulong)(((long)(bottom_blobs->
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x48)
                    <= uVar15) break;
                lVar7 = (long)*(int *)((long)pMVar2 + lVar4 + -0x14);
                lVar6 = *(long *)((long)pMVar2 + lVar4 + -0x30);
                memcpy(pvVar11,(void *)(uVar14 * lVar7 * lVar6 +
                                       *(long *)((long)&pMVar2->data + lVar4) * uVar13 * lVar6 +
                                       *(long *)((long)pMVar2 + lVar4 + -0x40)),lVar7 * _elemsize);
                pvVar11 = (void *)((long)pvVar11 +
                                  (long)*(int *)((long)pMVar2 + lVar4 + -0x14) * _elemsize);
                uVar15 = uVar15 + 1;
                lVar4 = lVar4 + 0x48;
              }
            }
          }
        }
      }
    }
  }
  return local_60;
}

Assistant:

int Concat::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    size_t elemsize = bottom_blobs[0].elemsize;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int w = bottom_blob.w;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, w * elemsize);

            outptr += w * elemsize;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int size = w * bottom_blob.h;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, size * elemsize);

            outptr += size * elemsize;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            unsigned char* outptr = top_blob.row<unsigned char>(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const unsigned char* ptr = bottom_blob.row<const unsigned char>(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elemsize;
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_channels += bottom_blob.c;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int q = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int channels = bottom_blob.c;
            size_t size = bottom_blob.cstep * channels;

            const unsigned char* ptr = bottom_blob;
            unsigned char* outptr = top_blob.channel(q);
            memcpy(outptr, ptr, size * elemsize);

            q += channels;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const unsigned char* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elemsize;
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const unsigned char* ptr = bottom_blob.channel(q).row<const unsigned char>(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w * elemsize;
                }
            }
        }

        return 0;
    }

    return 0;
}